

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool trans_DUP_s(DisasContext_conflict1 *s,arg_DUP_s *a)

{
  uint vece;
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  uint32_t oprsz;
  uint32_t dofs;
  TCGv_i64 in;
  uint vsz;
  TCGContext_conflict1 *tcg_ctx;
  arg_DUP_s *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  _Var1 = sve_access_check_aarch64(s);
  if (_Var1) {
    oprsz = vec_full_reg_size(s);
    vece = a->esz;
    dofs = vec_full_reg_offset(s,a->rd);
    in = cpu_reg_sp_aarch64(s,a->rn);
    tcg_gen_gvec_dup_i64_aarch64(tcg_ctx_00,vece,dofs,oprsz,oprsz,in);
  }
  return true;
}

Assistant:

static bool trans_DUP_s(DisasContext *s, arg_DUP_s *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (sve_access_check(s)) {
        unsigned vsz = vec_full_reg_size(s);
        tcg_gen_gvec_dup_i64(tcg_ctx, a->esz, vec_full_reg_offset(s, a->rd),
                             vsz, vsz, cpu_reg_sp(s, a->rn));
    }
    return true;
}